

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

int32_t icu_63::UnicodeSet::getSingleCP(UnicodeString *s)

{
  char16_t cVar1;
  int32_t iVar2;
  UChar32 cp;
  UnicodeString *s_local;
  
  iVar2 = UnicodeString::length(s);
  if (iVar2 < 3) {
    iVar2 = UnicodeString::length(s);
    if (iVar2 == 1) {
      cVar1 = UnicodeString::charAt(s,0);
      s_local._4_4_ = (uint)(ushort)cVar1;
    }
    else {
      s_local._4_4_ = UnicodeString::char32At(s,0);
      if ((int)s_local._4_4_ < 0x10000) {
        s_local._4_4_ = 0xffffffff;
      }
    }
  }
  else {
    s_local._4_4_ = 0xffffffff;
  }
  return s_local._4_4_;
}

Assistant:

int32_t UnicodeSet::getSingleCP(const UnicodeString& s) {
    //if (s.length() < 1) {
    //    throw new IllegalArgumentException("Can't use zero-length strings in UnicodeSet");
    //}
    if (s.length() > 2) return -1;
    if (s.length() == 1) return s.charAt(0);

    // at this point, len = 2
    UChar32 cp = s.char32At(0);
    if (cp > 0xFFFF) { // is surrogate pair
        return cp;
    }
    return -1;
}